

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O1

void enet_peer_setup_outgoing_command(ENetPeer *peer,ENetOutgoingCommand *outgoingCommand)

{
  byte bVar1;
  enet_uint16 eVar2;
  size_t sVar3;
  enet_uint16 *peVar4;
  
  peVar4 = (enet_uint16 *)
           ((long)peer->channels->reliableWindows +
           ((ulong)((uint)(outgoingCommand->command).header.channelID * 0x50) - 6));
  sVar3 = enet_protocol_command_size((outgoingCommand->command).header.command);
  peer->outgoingDataTotal =
       peer->outgoingDataTotal + (int)sVar3 + (uint)outgoingCommand->fragmentLength;
  if ((outgoingCommand->command).header.channelID == 0xff) {
    eVar2 = (short)*(undefined4 *)&peer->outgoingReliableSequenceNumber + 1;
    peer->outgoingReliableSequenceNumber = eVar2;
LAB_0015f587:
    outgoingCommand->reliableSequenceNumber = eVar2;
LAB_0015f59b:
    eVar2 = 0;
  }
  else {
    bVar1 = (outgoingCommand->command).header.command;
    if ((char)bVar1 < '\0') {
      eVar2 = (short)*(undefined4 *)peVar4 + 1;
      *peVar4 = eVar2;
      peVar4[1] = 0;
      goto LAB_0015f587;
    }
    if (0x3f < bVar1) {
      peer->outgoingUnsequencedGroup = peer->outgoingUnsequencedGroup + 1;
      outgoingCommand->reliableSequenceNumber = 0;
      goto LAB_0015f59b;
    }
    if (outgoingCommand->fragmentOffset == 0) {
      peVar4[1] = peVar4[1] + 1;
    }
    outgoingCommand->reliableSequenceNumber = *peVar4;
    eVar2 = peVar4[1];
  }
  outgoingCommand->unreliableSequenceNumber = eVar2;
  outgoingCommand->sendAttempts = 0;
  outgoingCommand->sentTime = 0;
  outgoingCommand->roundTripTimeout = 0;
  outgoingCommand->roundTripTimeoutLimit = 0;
  (outgoingCommand->command).header.reliableSequenceNumber =
       outgoingCommand->reliableSequenceNumber << 8 | outgoingCommand->reliableSequenceNumber >> 8;
  bVar1 = (outgoingCommand->command).header.command & 0xf;
  if (bVar1 == 9) {
    peVar4 = &peer->outgoingUnsequencedGroup;
  }
  else {
    if (bVar1 != 7) goto LAB_0015f5eb;
    peVar4 = &outgoingCommand->unreliableSequenceNumber;
  }
  (outgoingCommand->command).acknowledge.receivedReliableSequenceNumber =
       *peVar4 << 8 | *peVar4 >> 8;
LAB_0015f5eb:
  enet_list_insert(&(peer->outgoingCommands).sentinel,outgoingCommand);
  return;
}

Assistant:

void
enet_peer_setup_outgoing_command (ENetPeer * peer, ENetOutgoingCommand * outgoingCommand)
{
    ENetChannel * channel = & peer -> channels [outgoingCommand -> command.header.channelID];
    
    peer -> outgoingDataTotal += enet_protocol_command_size (outgoingCommand -> command.header.command) + outgoingCommand -> fragmentLength;

    if (outgoingCommand -> command.header.channelID == 0xFF)
    {
       ++ peer -> outgoingReliableSequenceNumber;

       outgoingCommand -> reliableSequenceNumber = peer -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)
    {
       ++ channel -> outgoingReliableSequenceNumber;
       channel -> outgoingUnreliableSequenceNumber = 0;

       outgoingCommand -> reliableSequenceNumber = channel -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED)
    {
       ++ peer -> outgoingUnsequencedGroup;

       outgoingCommand -> reliableSequenceNumber = 0;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    {
       if (outgoingCommand -> fragmentOffset == 0)
         ++ channel -> outgoingUnreliableSequenceNumber;
        
       outgoingCommand -> reliableSequenceNumber = channel -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = channel -> outgoingUnreliableSequenceNumber;
    }
   
    outgoingCommand -> sendAttempts = 0;
    outgoingCommand -> sentTime = 0;
    outgoingCommand -> roundTripTimeout = 0;
    outgoingCommand -> roundTripTimeoutLimit = 0;
    outgoingCommand -> command.header.reliableSequenceNumber = ENET_HOST_TO_NET_16 (outgoingCommand -> reliableSequenceNumber);

    switch (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK)
    {
    case ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE:
        outgoingCommand -> command.sendUnreliable.unreliableSequenceNumber = ENET_HOST_TO_NET_16 (outgoingCommand -> unreliableSequenceNumber);
        break;

    case ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED:
        outgoingCommand -> command.sendUnsequenced.unsequencedGroup = ENET_HOST_TO_NET_16 (peer -> outgoingUnsequencedGroup);
        break;
    
    default:
        break;
    }

    enet_list_insert (enet_list_end (& peer -> outgoingCommands), outgoingCommand);
}